

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O0

void __thiscall
Refal2::CModuleBuilder::SetOrdinary(CModuleBuilder *this,CToken *nameToken,CRulePtr *firstRule)

{
  bool bVar1;
  CPreparatoryFunction *function_00;
  CPreparatoryFunction *function;
  CRulePtr *firstRule_local;
  CToken *nameToken_local;
  CModuleBuilder *this_local;
  
  bVar1 = checkModuleExist(this,nameToken);
  if (bVar1) {
    function_00 = addFunction(this,nameToken);
    bVar1 = checkOnlyDeclared(this,function_00,nameToken);
    if (bVar1) {
      CPreparatoryFunction::SetDefined(function_00,nameToken);
      CPreparatoryFunction::SetOrdinary(function_00,firstRule);
    }
  }
  return;
}

Assistant:

void CModuleBuilder::SetOrdinary( const CToken& nameToken, CRulePtr& firstRule )
{
	if( !checkModuleExist( nameToken ) ) {
		return;
	}
	CPreparatoryFunction& function = addFunction( nameToken );
	if( checkOnlyDeclared( function, nameToken ) ) {
		function.SetDefined( nameToken );
		function.SetOrdinary( firstRule );
	}
}